

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_case.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::caseMap
          (UnicodeString *this,int32_t caseLocale,uint32_t options,BreakIterator *iter,
          UStringCaseMapper *stringCaseMapper)

{
  ushort uVar1;
  BreakIterator *pBVar2;
  UBool UVar3;
  int32_t iVar4;
  char16_t *pcVar5;
  int32_t unaff_EBP;
  char16_t *pcVar6;
  int textLength;
  bool bVar7;
  UErrorCode errorCode;
  int32_t local_3e0;
  uint32_t local_3dc;
  BreakIterator *local_3d8;
  UStringCaseMapper *local_3d0;
  char16_t *local_3c8;
  ConstChar16Ptr local_3c0;
  ConstChar16Ptr local_3b8;
  UChar *local_3b0;
  char16_t *local_3a0;
  Iterator ei;
  UnicodeString oldString;
  Edits edits;
  UChar oldBuffer [54];
  int32_t *bufferToDelete;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) != 0 || uVar1 < 0x20) {
    return this;
  }
  if ((short)uVar1 < 0) {
    textLength = (this->fUnion).fFields.fLength;
  }
  else {
    textLength = (int)(short)uVar1 >> 5;
  }
  local_3e0 = caseLocale;
  local_3dc = options;
  local_3d8 = iter;
  local_3d0 = stringCaseMapper;
  UVar3 = isBufferWritable(this);
  pBVar2 = local_3d8;
  errorCode = U_ZERO_ERROR;
  oldString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
  oldString.fUnion.fStackFields.fLengthAndFlags = 2;
  if (UVar3 == '\0') {
    if (textLength < 0x1b) goto LAB_002dcd12;
LAB_002dcd61:
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      pcVar6 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar6 = (this->fUnion).fStackFields.fBuffer;
    }
    edits.array = edits.stackArray;
    edits.capacity = 100;
    edits.length = 0;
    edits.delta = 0;
    edits.numChanges = 0;
    edits.errorCode_ = U_ZERO_ERROR;
    if (local_3d8 != (BreakIterator *)0x0) {
      local_3c0.p_ = pcVar6;
      setTo(&oldString,'\0',&local_3c0,textLength);
      local_3a0 = local_3c0.p_;
      (*(pBVar2->super_UObject)._vptr_UObject[7])(pBVar2,&oldString);
    }
    (*local_3d0)(local_3e0,local_3dc | 0x4000,pBVar2,(char16_t *)&bufferToDelete,200,pcVar6,
                 textLength,&edits,&errorCode);
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      unaff_EBP = edits.delta + textLength;
      if ((edits.delta < 1) ||
         (UVar3 = cloneArrayIfNeeded(this,unaff_EBP,unaff_EBP,'\x01',(int32_t **)0x0,'\0'),
         UVar3 != '\0')) {
        local_3c8 = pcVar6;
        Edits::getCoarseChangesIterator(&ei,&edits);
        while (UVar3 = Edits::Iterator::next(&ei,&errorCode), UVar3 != '\0') {
          doReplace(this,ei.destIndex,ei.oldLength_,(UChar *)&bufferToDelete,ei.replIndex,
                    ei.newLength_);
        }
        if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          bVar7 = false;
          pcVar6 = local_3c8;
          goto LAB_002dcfb2;
        }
        setToBogus(this);
        pcVar6 = local_3c8;
      }
      bVar7 = false;
    }
    else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      unaff_EBP = edits.delta + textLength;
      bVar7 = true;
    }
    else {
      setToBogus(this);
      bVar7 = false;
    }
LAB_002dcfb2:
    Edits::~Edits(&edits);
    if (!bVar7) goto LAB_002dd05b;
  }
  else {
    if (0x36 < textLength) goto LAB_002dcd61;
LAB_002dcd12:
    pcVar5 = (this->fUnion).fStackFields.fBuffer;
    pcVar6 = pcVar5;
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      pcVar6 = (this->fUnion).fFields.fArray;
    }
    u_memcpy_63(oldBuffer,pcVar6,textLength);
    if (UVar3 == '\0') {
      iVar4 = 0x1b;
      UVar3 = cloneArrayIfNeeded(this,0x1b,0x1b,'\0',(int32_t **)0x0,'\0');
      if (UVar3 == '\0') goto LAB_002dd05b;
    }
    else {
      iVar4 = 0x1b;
      pcVar5 = pcVar6;
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        iVar4 = (this->fUnion).fFields.fCapacity;
      }
    }
    if (local_3d8 != (BreakIterator *)0x0) {
      local_3b8.p_ = oldBuffer;
      setTo(&oldString,'\0',&local_3b8,textLength);
      local_3b0 = local_3b8.p_;
      (*(local_3d8->super_UObject)._vptr_UObject[7])(local_3d8,&oldString);
    }
    pcVar6 = oldBuffer;
    unaff_EBP = (*local_3d0)(local_3e0,local_3dc,local_3d8,pcVar5,iVar4,pcVar6,textLength,
                             (Edits *)0x0,&errorCode);
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      setLength(this,unaff_EBP);
      goto LAB_002dd05b;
    }
    if (errorCode != U_BUFFER_OVERFLOW_ERROR) {
      setToBogus(this);
      goto LAB_002dd05b;
    }
  }
  bufferToDelete = (int32_t *)0x0;
  UVar3 = cloneArrayIfNeeded(this,unaff_EBP,unaff_EBP,'\0',&bufferToDelete,'\x01');
  if (UVar3 != '\0') {
    errorCode = U_ZERO_ERROR;
    bVar7 = ((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0;
    pcVar5 = (this->fUnion).fStackFields.fBuffer;
    if (bVar7) {
      pcVar5 = (this->fUnion).fFields.fArray;
    }
    iVar4 = 0x1b;
    if (bVar7) {
      iVar4 = (this->fUnion).fFields.fCapacity;
    }
    iVar4 = (*local_3d0)(local_3e0,local_3dc,local_3d8,pcVar5,iVar4,pcVar6,textLength,(Edits *)0x0,
                         &errorCode);
    if (bufferToDelete != (int32_t *)0x0) {
      uprv_free_63(bufferToDelete);
    }
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      setLength(this,iVar4);
    }
    else {
      setToBogus(this);
    }
  }
LAB_002dd05b:
  ~UnicodeString(&oldString);
  return this;
}

Assistant:

UnicodeString &
UnicodeString::caseMap(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_PARAM
                       UStringCaseMapper *stringCaseMapper) {
  if(isEmpty() || !isWritable()) {
    // nothing to do
    return *this;
  }

  UChar oldBuffer[2 * US_STACKBUF_SIZE];
  UChar *oldArray;
  int32_t oldLength = length();
  int32_t newLength;
  UBool writable = isBufferWritable();
  UErrorCode errorCode = U_ZERO_ERROR;

#if !UCONFIG_NO_BREAK_ITERATION
  // Read-only alias to the original string contents for the titlecasing BreakIterator.
  // We cannot set the iterator simply to *this because *this is being modified.
  UnicodeString oldString;
#endif

  // Try to avoid heap-allocating a new character array for this string.
  if (writable ? oldLength <= UPRV_LENGTHOF(oldBuffer) : oldLength < US_STACKBUF_SIZE) {
    // Short string: Copy the contents into a temporary buffer and
    // case-map back into the current array, or into the stack buffer.
    UChar *buffer = getArrayStart();
    int32_t capacity;
    oldArray = oldBuffer;
    u_memcpy(oldBuffer, buffer, oldLength);
    if (writable) {
      capacity = getCapacity();
    } else {
      // Switch from the read-only alias or shared heap buffer to the stack buffer.
      if (!cloneArrayIfNeeded(US_STACKBUF_SIZE, US_STACKBUF_SIZE, /* doCopyArray= */ FALSE)) {
        return *this;
      }
      U_ASSERT(fUnion.fFields.fLengthAndFlags & kUsingStackBuffer);
      buffer = fUnion.fStackFields.fBuffer;
      capacity = US_STACKBUF_SIZE;
    }
#if !UCONFIG_NO_BREAK_ITERATION
    if (iter != nullptr) {
      oldString.setTo(FALSE, oldArray, oldLength);
      iter->setText(oldString);
    }
#endif
    newLength = stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                                 buffer, capacity,
                                 oldArray, oldLength, NULL, errorCode);
    if (U_SUCCESS(errorCode)) {
      setLength(newLength);
      return *this;
    } else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      // common overflow handling below
    } else {
      setToBogus();
      return *this;
    }
  } else {
    // Longer string or read-only buffer:
    // Collect only changes and then apply them to this string.
    // Case mapping often changes only small parts of a string,
    // and often does not change its length.
    oldArray = getArrayStart();
    Edits edits;
    UChar replacementChars[200];
#if !UCONFIG_NO_BREAK_ITERATION
    if (iter != nullptr) {
      oldString.setTo(FALSE, oldArray, oldLength);
      iter->setText(oldString);
    }
#endif
    stringCaseMapper(caseLocale, options | U_OMIT_UNCHANGED_TEXT, UCASEMAP_BREAK_ITERATOR
                     replacementChars, UPRV_LENGTHOF(replacementChars),
                     oldArray, oldLength, &edits, errorCode);
    if (U_SUCCESS(errorCode)) {
      // Grow the buffer at most once, not for multiple doReplace() calls.
      newLength = oldLength + edits.lengthDelta();
      if (newLength > oldLength && !cloneArrayIfNeeded(newLength, newLength)) {
        return *this;
      }
      for (Edits::Iterator ei = edits.getCoarseChangesIterator(); ei.next(errorCode);) {
        doReplace(ei.destinationIndex(), ei.oldLength(),
                  replacementChars, ei.replacementIndex(), ei.newLength());
      }
      if (U_FAILURE(errorCode)) {
        setToBogus();
      }
      return *this;
    } else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      // common overflow handling below
      newLength = oldLength + edits.lengthDelta();
    } else {
      setToBogus();
      return *this;
    }
  }

  // Handle buffer overflow, newLength is known.
  // We need to allocate a new buffer for the internal string case mapping function.
  // This is very similar to how doReplace() keeps the old array pointer
  // and deletes the old array itself after it is done.
  // In addition, we are forcing cloneArrayIfNeeded() to always allocate a new array.
  int32_t *bufferToDelete = 0;
  if (!cloneArrayIfNeeded(newLength, newLength, FALSE, &bufferToDelete, TRUE)) {
    return *this;
  }
  errorCode = U_ZERO_ERROR;
  // No need to iter->setText() again: The case mapper restarts via iter->first().
  newLength = stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                               getArrayStart(), getCapacity(),
                               oldArray, oldLength, NULL, errorCode);
  if (bufferToDelete) {
    uprv_free(bufferToDelete);
  }
  if (U_SUCCESS(errorCode)) {
    setLength(newLength);
  } else {
    setToBogus();
  }
  return *this;
}